

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_histogram<double,_(unsigned_char)'\x02'>::observe
          (basic_dynamic_histogram<double,_(unsigned_char)__x02_> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_value,double value)

{
  iterator __val;
  iterator __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  double value_00;
  basic_dynamic_counter<double,_(unsigned_char)__x02_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_XMM0_Qa;
  size_t bucket_index;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffe0;
  
  __val = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  __last = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  __first = std::
            lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                      (in_XMM0_Qa,in_stack_ffffffffffffffe0,__val._M_current);
  value_00 = (double)std::
                     distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                               (__first,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                         )__last._M_current);
  std::
  __shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x260985);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::inc
            (in_RSI,(label_key_type)in_XMM0_Qa._M_current,value_00);
  std::
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
  ::operator[]((vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                *)&in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(size_type)value_00);
  std::
  __shared_ptr_access<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2609b5);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::inc
            (in_RSI,(label_key_type)in_XMM0_Qa._M_current,value_00);
  return;
}

Assistant:

void observe(const std::array<std::string, N> &labels_value,
               value_type value) {
    const auto bucket_index = static_cast<std::size_t>(
        std::distance(bucket_boundaries_.begin(),
                      std::lower_bound(bucket_boundaries_.begin(),
                                       bucket_boundaries_.end(), value)));
    sum_->inc(labels_value, value);
    bucket_counts_[bucket_index]->inc(labels_value);
  }